

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestCamelCaseFieldNames *pTVar2;
  string *psVar3;
  TestCamelCaseFieldNames **v1;
  TestCamelCaseFieldNames **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  RepeatedField<int> *pRVar5;
  RepeatedField<int> *pRVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  RepeatedPtrField<proto2_unittest::ForeignMessage> *this;
  RepeatedPtrField<proto2_unittest::ForeignMessage> *other;
  uint32_t *puVar9;
  Arena *pAVar10;
  ForeignMessage *pFVar11;
  LogMessage local_d8;
  Voidify local_c1;
  uint local_c0;
  uint32_t cached_has_bits;
  LogMessage local_b0;
  Voidify local_99;
  TestCamelCaseFieldNames *local_98;
  Nullable<const_char_*> local_90;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestCamelCaseFieldNames *from;
  TestCamelCaseFieldNames *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_58;
  string *local_50;
  TestCamelCaseFieldNames *local_48;
  anon_union_176_1_493b367e_for_TestCamelCaseFieldNames_3 *local_40;
  string *local_38;
  TestCamelCaseFieldNames *local_30;
  anon_union_176_1_493b367e_for_TestCamelCaseFieldNames_3 *local_28;
  string *local_20;
  TestCamelCaseFieldNames *local_18;
  anon_union_176_1_493b367e_for_TestCamelCaseFieldNames_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestCamelCaseFieldNames *)to_msg;
  _this = (TestCamelCaseFieldNames *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_98 = (TestCamelCaseFieldNames *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestCamelCaseFieldNames_const*>(&local_98);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestCamelCaseFieldNames*>(&from);
  local_90 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestCamelCaseFieldNames_const*,proto2_unittest::TestCamelCaseFieldNames*>
                       (v1,v2,"&from != _this");
  if (local_90 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_90);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x6c54,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b0);
  }
  local_c0 = 0;
  pRVar5 = _internal_mutable_repeatedprimitivefield(from);
  pRVar6 = _internal_repeatedprimitivefield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar5,pRVar6);
  pRVar7 = _internal_mutable_repeatedstringfield_abi_cxx11_(from);
  pRVar8 = _internal_repeatedstringfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar7,pRVar8);
  pRVar5 = _internal_mutable_repeatedenumfield(from);
  pRVar6 = _internal_repeatedenumfield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar5,pRVar6);
  this = _internal_mutable_repeatedmessagefield(from);
  other = _internal_repeatedmessagefield((TestCamelCaseFieldNames *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessage>::MergeFrom(this,other);
  pRVar7 = _internal_mutable_repeatedstringpiecefield_abi_cxx11_(from);
  pRVar8 = _internal_repeatedstringpiecefield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar7,pRVar8);
  pRVar7 = _internal_mutable_repeatedcordfield_abi_cxx11_(from);
  pRVar8 = _internal_repeatedcordfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar7,pRVar8);
  puVar9 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pTVar2 = from;
  local_c0 = *puVar9;
  if ((local_c0 & 0x3f) != 0) {
    if ((local_c0 & 1) != 0) {
      local_50 = _internal_stringfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
      local_48 = pTVar2;
      local_40 = &pTVar2->field_0;
      puVar9 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar9 = *puVar9 | 1;
      pAVar10 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.stringfield_,psVar3,pAVar10);
    }
    pTVar2 = from;
    if ((local_c0 & 2) != 0) {
      local_38 = _internal_stringpiecefield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
      local_30 = pTVar2;
      local_28 = &pTVar2->field_0;
      puVar9 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar9 = *puVar9 | 2;
      pAVar10 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.stringpiecefield_,psVar3,pAVar10);
    }
    pTVar2 = from;
    if ((local_c0 & 4) != 0) {
      local_20 = _internal_cordfield_abi_cxx11_((TestCamelCaseFieldNames *)arena);
      local_18 = pTVar2;
      local_10 = &pTVar2->field_0;
      puVar9 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pTVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar9 = *puVar9 | 4;
      pAVar10 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar2->field_0)._impl_.cordfield_,psVar3,pAVar10);
    }
    if ((local_c0 & 8) != 0) {
      if (arena[1].impl_.alloc_policy_.policy_ == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
                   ,0x6c6b,"from._impl_.messagefield_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c1,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d8);
      }
      if ((from->field_0)._impl_.messagefield_ == (ForeignMessage *)0x0) {
        to_msg_local = (MessageLite *)arena[1].impl_.alloc_policy_.policy_;
        local_58 = absl_log_internal_check_op_result;
        pFVar11 = (ForeignMessage *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessage>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.messagefield_ = pFVar11;
      }
      else {
        proto2_unittest::ForeignMessage::MergeFrom
                  ((from->field_0)._impl_.messagefield_,
                   (ForeignMessage *)arena[1].impl_.alloc_policy_.policy_);
      }
    }
    if ((local_c0 & 0x10) != 0) {
      (from->field_0)._impl_.primitivefield_ = *(int32_t *)&arena[1].impl_.field_0x10;
    }
    if ((local_c0 & 0x20) != 0) {
      (from->field_0)._impl_.enumfield_ = *(int *)&arena[1].impl_.field_0x14;
    }
  }
  uVar1 = local_c0;
  puVar9 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar9 = uVar1 | *puVar9;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}